

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

void __thiscall ipx::Basis::Basis(Basis *this,Control *control,Model *model)

{
  Int IVar1;
  ipxint iVar2;
  pointer new_pivottol;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  LuUpdate *this_00;
  unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> lu;
  Int n;
  Int m;
  pointer in_stack_ffffffffffffff58;
  BasicLuKernel *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff78;
  Basis *in_stack_ffffffffffffff80;
  unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>
  *in_stack_ffffffffffffffc8;
  Int in_stack_ffffffffffffffd4;
  Control *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x80a4a1);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x80a4b4);
  std::unique_ptr<ipx::LuUpdate,std::default_delete<ipx::LuUpdate>>::
  unique_ptr<std::default_delete<ipx::LuUpdate>,void>
            ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)
             in_stack_ffffffffffffff60);
  *(undefined4 *)((long)in_RDI + 0x4c) = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x80a52a);
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  IVar1 = Model::rows((Model *)in_RDI[1]);
  Model::cols((Model *)in_RDI[1]);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  iVar2 = Control::lu_kernel((Control *)*in_RDI);
  if (iVar2 < 1) {
    in_stack_ffffffffffffff80 = (Basis *)(in_RDI + 8);
    operator_new(0xe0);
    BasicLu::BasicLu((BasicLu *)CONCAT44(IVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
                     in_stack_ffffffffffffffd4);
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::reset
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)
               in_stack_ffffffffffffff60,(pointer)in_stack_ffffffffffffff58);
  }
  else {
    operator_new(0x10);
    BasicLuKernel::BasicLuKernel(in_stack_ffffffffffffff60);
    std::unique_ptr<ipx::LuFactorization,std::default_delete<ipx::LuFactorization>>::
    unique_ptr<std::default_delete<ipx::LuFactorization>,void>
              ((unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *)
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    operator_new(0x260);
    ForrestTomlin::ForrestTomlin
              ((ForrestTomlin *)CONCAT44(IVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
    std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::reset
              ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)
               in_stack_ffffffffffffff60,(pointer)in_stack_ffffffffffffff58);
    std::unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>::~unique_ptr
              ((unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *)
               in_stack_ffffffffffffff60);
  }
  new_pivottol = std::unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>::operator->
                           ((unique_ptr<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_> *)
                            0x80a723);
  this_00 = (LuUpdate *)Control::lu_pivottol((Control *)*in_RDI);
  LuUpdate::pivottol(this_00,(double)new_pivottol);
  SetToSlackBasis(in_stack_ffffffffffffff80);
  return;
}

Assistant:

Basis::Basis(const Control& control, const Model& model)
    : control_(control), model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    basis_.resize(m);
    map2basis_.resize(n+m);
    if (control_.lu_kernel() <= 0) {
        lu_.reset(new BasicLu(control_, m));
    } else {
        std::unique_ptr<LuFactorization> lu(new BasicLuKernel);
        lu_.reset(new ForrestTomlin(control_, m, lu));
    }
    lu_->pivottol(control_.lu_pivottol());
    SetToSlackBasis();
}